

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O0

err_t cmdSigSign(char *sig_name,char *name,char *certs,octet *date,octet *privkey,size_t privkey_len
                )

{
  bool_t bVar1;
  char *buf;
  octet *poVar2;
  char *state;
  octet *poVar3;
  char *oid;
  octet *in_RCX;
  octet *in_RDX;
  octet *in_RSI;
  bign_params *in_RDI;
  octet *in_R8;
  octet *in_R9;
  void *in_stack_00000010;
  size_t cert_len;
  size_t offset;
  size_t t_len;
  octet *t;
  octet *hash;
  size_t oid_len;
  octet *oid_der;
  bign_params *params;
  cmd_sig_t *sig;
  void *stack;
  err_t code;
  void *in_stack_ffffffffffffff58;
  size_t *in_stack_ffffffffffffff60;
  bign_params *in_stack_ffffffffffffff68;
  cmd_sig_t *in_stack_ffffffffffffff70;
  size_t *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  char *name_00;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar4;
  
  bVar1 = strIsValid((char *)in_stack_ffffffffffffff60);
  if ((((bVar1 == 0) || (bVar1 = strIsValid((char *)in_stack_ffffffffffffff60), bVar1 == 0)) ||
      ((in_R9 != (octet *)0x18 &&
       (((in_R9 != (octet *)0x20 && (in_R9 != (octet *)0x30)) && (in_R9 != (octet *)0x40)))))) ||
     ((bVar1 = memIsValid(in_RCX,6), bVar1 == 0 ||
      (bVar1 = memIsValid(in_R8,(size_t)in_R9), bVar1 == 0)))) {
    eVar4 = 0x6d;
  }
  else {
    bVar1 = memIsZero(in_RCX,6);
    if ((bVar1 == 0) && (bVar1 = tmDateIsValid2((octet *)in_stack_ffffffffffffff60), bVar1 == 0)) {
      eVar4 = 0x134;
    }
    else {
      buf = (char *)blobCreate((size_t)in_stack_ffffffffffffff58);
      eVar4 = 0x6e;
      if (buf != (char *)0x0) {
        eVar4 = 0;
      }
      if (eVar4 == 0) {
        poVar2 = (octet *)(buf + 0x630);
        state = buf + 0x780;
        poVar3 = (octet *)(buf + 0x790 + (long)in_R9);
        name_00 = buf;
        memCopy(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0x109224);
        if (in_RDX == (octet *)0x0) {
          buf[0x620] = '\0';
          buf[0x621] = '\0';
          buf[0x622] = '\0';
          buf[0x623] = '\0';
          buf[0x624] = '\0';
          buf[0x625] = '\0';
          buf[0x626] = '\0';
          buf[0x627] = '\0';
        }
        else {
          buf[0x620] = -0x4c;
          buf[0x621] = '\x05';
          buf[0x622] = '\0';
          buf[0x623] = '\0';
          buf[0x624] = '\0';
          buf[0x625] = '\0';
          buf[0x626] = '\0';
          buf[0x627] = '\0';
          eVar4 = cmdCVCsCreate(poVar3,in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
          if (eVar4 != 0) {
            blobClose((blob_t)0x10927a);
            return eVar4;
          }
          eVar4 = cmdCVCsVal(poVar3,(size_t)in_stack_ffffffffffffff80,
                             (octet *)in_stack_ffffffffffffff78);
          if (eVar4 != 0) {
            blobClose((blob_t)0x1092c5);
            return eVar4;
          }
        }
        if (*(long *)(buf + 0x620) != 0) {
          eVar4 = cmdCVCsGetLast(in_stack_ffffffffffffff78,(size_t *)in_stack_ffffffffffffff70,
                                 (octet *)in_stack_ffffffffffffff68,
                                 (size_t)in_stack_ffffffffffffff60);
          if (eVar4 != 0) {
            blobClose((blob_t)0x109333);
            return eVar4;
          }
          eVar4 = btokCVCMatch((octet *)in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
                               (octet *)in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60)
          ;
          if (eVar4 != 0) {
            blobClose((blob_t)0x10937a);
            return eVar4;
          }
        }
        eVar4 = cmdSigParamsStd(in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        if (eVar4 == 0) {
          oid = buf + 0x628;
          eVar4 = cmdSigHash(in_R9,(ulong)in_stack_ffffffffffffffc0,name_00,(size_t)buf,poVar2,
                             (size_t)state,in_RDX);
          if (eVar4 == 0) {
            if (in_R9 < (octet *)0x21) {
              eVar4 = bignOidToDER((octet *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,oid)
              ;
              if (eVar4 != 0) {
                blobClose((blob_t)0x109455);
                return eVar4;
              }
            }
            else {
              eVar4 = bignOidToDER((octet *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,oid)
              ;
              if (eVar4 != 0) {
                blobClose((blob_t)0x1094a6);
                return eVar4;
              }
            }
            bVar1 = rngIsValid();
            if (bVar1 == 0) {
              poVar2 = (octet *)0x0;
            }
            else {
              poVar3 = in_R9;
              rngStepR(buf,(size_t)poVar2,state);
              poVar2 = in_R9;
              in_R9 = poVar3;
            }
            if (in_R9 == (octet *)0x18) {
              eVar4 = bign96Sign2((octet *)CONCAT44(in_stack_fffffffffffffffc,
                                                    in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                  (size_t)in_RDX,in_RCX,in_R8,in_stack_00000010,cert_len);
              buf[0x60] = '\"';
              buf[0x61] = '\0';
              buf[0x62] = '\0';
              buf[99] = '\0';
              buf[100] = '\0';
              buf[0x65] = '\0';
              buf[0x66] = '\0';
              buf[0x67] = '\0';
            }
            else {
              eVar4 = bignSign2((octet *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                (size_t)in_RDX,in_RCX,in_R8,in_stack_00000010,cert_len);
              *(ulong *)(buf + 0x60) = ((ulong)in_R9 >> 1) * 3;
            }
            if (eVar4 == 0) {
              bVar1 = cmdFileAreSame((char *)poVar2,(char *)in_stack_ffffffffffffff78);
              if (bVar1 == 0) {
                eVar4 = cmdSigWrite((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              }
              else {
                eVar4 = cmdSigAppend((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
              }
              blobClose((blob_t)0x1095f7);
            }
            else {
              blobClose((blob_t)0x109598);
            }
          }
          else {
            blobClose((blob_t)0x109412);
          }
        }
        else {
          blobClose((blob_t)0x1093b0);
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t cmdSigSign(const char* sig_name, const char* name, const char* certs,
	const octet date[6], const octet privkey[], size_t privkey_len)
{
	err_t code;
	void* stack;
	cmd_sig_t* sig;
	bign_params* params;
	octet* oid_der;
	size_t oid_len = 16;
	octet* hash;
	octet* t;
	size_t t_len;
	// входной контроль
	if (!strIsValid(sig_name) || !strIsValid(name) ||
		!(privkey_len == 24 || privkey_len == 32 || privkey_len == 48 || 
			privkey_len == 64) ||
		!memIsValid(date, 6) ||
		!memIsValid(privkey, privkey_len))
		return ERR_BAD_INPUT;
	if (!memIsZero(date, 6) && !tmDateIsValid2(date))
		return ERR_BAD_DATE;
	// выделить и разметить память
	code = cmdBlobCreate(stack,
		sizeof(cmd_sig_t) + sizeof(bign_params) + oid_len + 2 * privkey_len);
	ERR_CALL_CHECK(code);
	sig = (cmd_sig_t*)stack;
	params = (bign_params*)(sig + 1);
	oid_der = (octet*)(params + 1);
	hash = oid_der + 16;
	t = hash + privkey_len;
	// зафиксировать дату
	memCopy(sig->date, date, 6);
	// указаны сертификаты?
	if (certs)
	{
		// собрать сертификаты
		sig->certs_len = sizeof(sig->certs);
		code = cmdCVCsCreate(sig->certs, &sig->certs_len, certs);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить цепочку
		code = cmdCVCsVal(sig->certs, sig->certs_len, sig->date);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	else
		sig->certs_len = 0;
	// проверить соответствие личному ключу
	if (sig->certs_len)
	{
		size_t offset;
		size_t cert_len;
		// найти последний сертификат
		code = cmdCVCsGetLast(&offset, &cert_len, sig->certs, sig->certs_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить соответствие личному ключу
		code = btokCVCMatch(sig->certs + offset, cert_len, privkey,
			privkey_len);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// загрузить долговременные параметры
	code = cmdSigParamsStd(params, privkey_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// хэшировать
	code = cmdSigHash(hash, privkey_len, name, 0, sig->certs, sig->certs_len, 
		sig->date);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	if (privkey_len <= 32)
	{
		code = bignOidToDER(oid_der, &oid_len, "1.2.112.0.2.0.34.101.31.81");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	else 
	{
		code = bignOidToDER(oid_der, &oid_len, privkey_len == 48 ? 
			"1.2.112.0.2.0.34.101.77.12" : "1.2.112.0.2.0.34.101.77.13");
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		ASSERT(oid_len == 11);
	}
	// получить случайные числа
	if (rngIsValid())
		rngStepR(t, t_len = privkey_len, 0);
	else
		t_len = 0;
	// подписать
	if (privkey_len == 24)
	{
		code = bign96Sign2(sig->sig, params, oid_der, oid_len, hash, privkey, 
			t, t_len);
		sig->sig_len = 34;
	}
	else
	{
		code = bignSign2(sig->sig, params, oid_der, oid_len, hash, privkey, 
			t, t_len);
		sig->sig_len = privkey_len / 2 * 3;
	}
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// сохранить подпись
	if (cmdFileAreSame(name, sig_name))
		code = cmdSigAppend(sig_name, sig);
	else
		code = cmdSigWrite(sig_name, sig);
	// завершить
	cmdBlobClose(stack);
	return code;
}